

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void modstltest2(void)

{
  double *seasonal;
  double *trend;
  double *remainder;
  double local_6d8;
  double x [211];
  int local_34 [2];
  int s_window;
  
  memcpy(&local_6d8,&DAT_00157950,0x698);
  local_34[0] = 0xd;
  seasonal = (double *)calloc(0xd3,8);
  trend = (double *)calloc(0xd3,8);
  remainder = (double *)calloc(0xd3,8);
  modstl(&local_6d8,0xd3,4,local_34,(double *)0x0,seasonal,trend,remainder);
  mdisplay(seasonal,1,0xd3);
  mdisplay(trend,1,0xd3);
  mdisplay(remainder,1,0xd3);
  free(seasonal);
  free(trend);
  free(remainder);
  return;
}

Assistant:

void modstltest2() {
	int N = 211;
	double x[211] = {284., 213., 227., 308.,
                     262., 228., 236., 320.,
                     272., 233., 237., 313.,
                     261., 227., 250., 314.,
                     286., 227., 260., 311.,
                     295., 233., 257., 339.,
                     279., 250., 270., 346.,
                     294., 255., 278., 363.,
                     313., 273., 300., 370.,
                     331., 288., 306., 386.,
                     335., 288., 308., 402.,
                     353., 316., 325., 405.,
                     393., 319., 327., 442.,
                     383., 332., 361., 446.,
                     387., 357., 374., 466.,
                     410., 370., 379., 487.,
                     419., 378., 393., 506.,
                     458., 387., 427., 565.,
                     465., 445., 450., 556.,
                     500., 452., 435., 554.,
                     510., 433., 453., 548.,
                     486., 453., 457., 566.,
                     515., 464., 431., 588.,
                     503., 443., 448., 555.,
                     513., 427., 473., 526.,
                     548., 440., 469., 575.,
                     493., 433., 480., 576.,
                     475., 405., 435., 535.,
                     453., 430., 417., 552.,
                     464., 417., 423., 554.,
                     459., 428., 429., 534.,
                     481., 416., 440., 538.,
                     474., 440., 447., 598.,
                     467., 439., 446., 567.,
                     485., 441., 429., 599.,
                     464., 424., 436., 574.,
                     443., 410., 420., 532.,
                     433., 421., 410., 512.,
                     449., 381., 423., 531.,
                     426., 408., 416., 520.,
                     409., 398., 398., 507.,
                     432., 398., 406., 526.,
                     428., 397., 403., 517.,
                     435., 383., 424., 521.,
                     421., 402., 414., 500.,
                     451., 380., 416., 492.,
                     428., 408., 406., 506.,
                     435., 380., 421., 490.,
                     435., 390., 412., 454.,
                     416., 403., 408., 482.,
                     438., 386., 405., 491.,
                     427., 383., 394., 473.,
                     420., 390., 410.};
	int f = 4;
	double *seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double*)calloc(N,sizeof(double));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	//stl(x,N,f,s_window_type,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seasonal,trend,remainder);

	modstl(x,N,f,&s_window,NULL,seasonal,trend,remainder);

	mdisplay(seasonal,1,N);
	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);
	free(seasonal);
	free(trend);
	free(remainder);
}